

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
ft::map<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::~map
          (map<int,_int,_ft::greater<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this)

{
  ~map(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~map() {
		this->clear();
	}